

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# showref.cpp
# Opt level: O1

string * __thiscall
duckdb::ShowRef::ToString_abi_cxx11_(string *__return_storage_ptr__,ShowRef *this)

{
  int iVar1;
  pointer pQVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl == (QueryNode *)0x0) {
    iVar1 = ::std::__cxx11::string::compare((char *)&this->table_name);
    if (iVar1 != 0) {
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(this->table_name)._M_dataplus._M_p);
    }
  }
  else {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pQVar2 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                       (&this->query);
    (*pQVar2->_vptr_QueryNode[3])(local_38,pQVar2);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_38[0]);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string ShowRef::ToString() const {
	string result;
	if (show_type == ShowType::SUMMARY) {
		result += "SUMMARIZE ";
	} else {
		result += "DESCRIBE ";
	}
	if (query) {
		result += "(";
		result += query->ToString();
		result += ")";
	} else if (table_name != "__show_tables_expanded") {
		result += table_name;
	}
	return result;
}